

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.h
# Opt level: O0

void __thiscall Refal2::CArbitraryInteger::CArbitraryInteger(CArbitraryInteger *this)

{
  CArbitraryInteger *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  Zero(this);
  return;
}

Assistant:

CArbitraryInteger() { Zero(); }